

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmExtb<(moira::Instr)155,(moira::Mode)0,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  StrWriter *pSVar1;
  Av<(moira::Instr)155,_(moira::Mode)0,_4> local_1c;
  
  pSVar1 = StrWriter::operator<<(str);
  pSVar1 = StrWriter::operator<<(pSVar1);
  StrWriter::operator<<(pSVar1,(Tab)(str->tab).raw);
  StrWriter::operator<<(pSVar1,(Dn)(op & 7));
  local_1c.ext1 = 0;
  StrWriter::operator<<(str,&local_1c);
  return;
}

Assistant:

void
Moira::dasmExtb(StrWriter &str, u32 &addr, u16 op) const
{
    auto src = Dn ( _____________xxx(op) );

    str << Ins<I>{} << Sz<S>{} << str.tab << Dn{src};
    str << Av<I, M, S>{};
}